

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::AddBuiltinCommand(cmState *this,string *name,cmCommand *command)

{
  __type _Var1;
  bool bVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_78;
  _Self local_50;
  _Self local_48;
  string local_40;
  cmCommand *local_20;
  cmCommand *command_local;
  string *name_local;
  cmState *this_local;
  
  local_20 = command;
  command_local = (cmCommand *)name;
  name_local = (string *)this;
  cmsys::SystemTools::LowerCase(&local_40,name);
  _Var1 = std::operator==(name,&local_40);
  if (!_Var1) {
    __assert_fail("name == cmSystemTools::LowerCase(name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                  ,0x1a8,"void cmState::AddBuiltinCommand(const std::string &, cmCommand *)");
  }
  std::__cxx11::string::~string((string *)&local_40);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::find(&this->BuiltinCommands,(key_type *)command_local);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::end(&this->BuiltinCommands);
  bVar2 = std::operator==(&local_48,&local_50);
  if (!bVar2) {
    __assert_fail("this->BuiltinCommands.find(name) == this->BuiltinCommands.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                  ,0x1a9,"void cmState::AddBuiltinCommand(const std::string &, cmCommand *)");
  }
  std::make_pair<std::__cxx11::string_const&,cmCommand*&>
            (&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command_local,
             &local_20);
  std::
  map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
  ::insert<std::pair<std::__cxx11::string,cmCommand*>>
            ((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
              *)&this->BuiltinCommands,&local_78);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  ::~pair(&local_78);
  return;
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name, cmCommand* command)
{
  assert(name == cmSystemTools::LowerCase(name));
  assert(this->BuiltinCommands.find(name) == this->BuiltinCommands.end());
  this->BuiltinCommands.insert(std::make_pair(name, command));
}